

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
::addObject(SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            *this,string *name,
           shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *obj,char type)

{
  initializer_list<char> __l;
  byte bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar2;
  allocator_type local_8a;
  char local_89;
  iterator local_88;
  size_type local_80;
  vector<char,_std::allocator<char>_> local_78;
  _Base_ptr local_60;
  undefined1 local_58;
  _Base_ptr local_40;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  res;
  lock_guard<std::mutex> lock;
  char type_local;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *obj_local;
  string *name_local;
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&res.second,&this->mapLock);
  pVar2 = std::
          map<std::__cxx11::string,std::shared_ptr<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<std::__cxx11::string>>
                    ((map<std::__cxx11::string,std::shared_ptr<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::__cxx11::string>>>>
                      *)&this->objectMap,name,obj);
  local_60 = (_Base_ptr)pVar2.first._M_node;
  local_58 = pVar2.second;
  local_40 = local_60;
  res.first._M_node._0_1_ = local_58;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_88 = &local_89;
    local_80 = 1;
    local_89 = type;
    std::allocator<char>::allocator();
    __l._M_len = local_80;
    __l._M_array = local_88;
    std::vector<char,_std::allocator<char>_>::vector(&local_78,__l,&local_8a);
    std::
    map<std::__cxx11::string,std::vector<char,std::allocator<char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
    ::emplace<std::__cxx11::string_const&,std::vector<char,std::allocator<char>>>
              ((map<std::__cxx11::string,std::vector<char,std::allocator<char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<char,std::allocator<char>>>>>
                *)&this->typeMap,name,&local_78);
    std::vector<char,_std::allocator<char>_>::~vector(&local_78);
    std::allocator<char>::~allocator(&local_8a);
  }
  bVar1 = (byte)res.first._M_node;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&res.second);
  return (bool)(bVar1 & 1);
}

Assistant:

bool addObject(const std::string& name, std::shared_ptr<X> obj, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto res = objectMap.emplace(name, std::move(obj));
        if (res.second) {
            typeMap.emplace(name, std::vector<Y>{type});
        }
        return res.second;
    }